

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::(anonymous_namespace)::ToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view input,
          bool lower_first)

{
  char cVar1;
  uchar *puVar2;
  size_t t;
  unsigned_long t_00;
  char *pcVar3;
  LogMessage *pLVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  string_view input_00;
  undefined1 auVar5 [16];
  LogMessage local_98;
  Voidify local_81;
  unsigned_long local_80;
  anon_unknown_24 *local_78;
  size_t sStack_70;
  unsigned_long local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  const_iterator pvStack_50;
  char character;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  undefined1 local_23;
  byte local_22;
  byte local_21;
  undefined1 auStack_20 [6];
  bool capitalize_next;
  bool lower_first_local;
  string_view input_local;
  string *result;
  
  input_local._M_len = input._M_len;
  local_21 = (byte)input._M_str & 1;
  local_22 = ~local_21 & 1;
  local_23 = 0;
  _auStack_20 = this;
  input_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __begin2 = auStack_20;
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)__begin2);
  pvStack_50 = std::basic_string_view<char,_std::char_traits<char>_>::end
                         ((basic_string_view<char,_std::char_traits<char>_> *)__begin2);
  pcVar3 = extraout_RDX;
  for (; __end2 != pvStack_50; __end2 = __end2 + 1) {
    absl_log_internal_check_op_result._7_1_ = *__end2;
    if (absl_log_internal_check_op_result._7_1_ == '_') {
      local_22 = 1;
    }
    else if ((local_22 & 1) == 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      pcVar3 = extraout_RDX_01;
    }
    else {
      absl::lts_20250127::ascii_toupper(absl_log_internal_check_op_result._7_1_);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      local_22 = 0;
      pcVar3 = extraout_RDX_00;
    }
  }
  if ((local_21 & 1) != 0) {
    auVar5 = std::__cxx11::string::empty();
    pcVar3 = auVar5._8_8_;
    if ((auVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      cVar1 = absl::lts_20250127::ascii_tolower(*puVar2);
      auVar5 = std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      pcVar3 = auVar5._8_8_;
      *auVar5._0_8_ = cVar1;
    }
  }
  local_78 = (anon_unknown_24 *)_auStack_20;
  sStack_70 = input_local._M_len;
  input_00._M_str = pcVar3;
  input_00._M_len = input_local._M_len;
  t = anon_unknown_24::CamelCaseSize((anon_unknown_24 *)_auStack_20,input_00);
  local_68 = absl::lts_20250127::log_internal::GetReferenceableValue(t);
  t_00 = std::__cxx11::string::size();
  local_80 = absl::lts_20250127::log_internal::GetReferenceableValue(t_00);
  local_60 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                       (&local_68,&local_80,"CamelCaseSize(input) == result.size()");
  if (local_60 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x7f,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToCamelCase(const absl::string_view input, bool lower_first) {
  bool capitalize_next = !lower_first;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(absl::ascii_toupper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  // Lower-case the first letter.
  if (lower_first && !result.empty()) {
    result[0] = absl::ascii_tolower(result[0]);
  }

  ABSL_DCHECK_EQ(CamelCaseSize(input), result.size());

  return result;
}